

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O3

int ndn_signature_value_tlv_decode(ndn_decoder_t *decoder,ndn_signature_t *signature)

{
  byte bVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  puVar3 = decoder->input_value;
  uVar7 = decoder->offset;
  bVar1 = puVar3[uVar7];
  uVar5 = (uint)bVar1;
  uVar2 = decoder->input_size;
  if (bVar1 < 0xfd) {
    iVar6 = 1;
  }
  else if (uVar2 - uVar7 < 3 || bVar1 != 0xfd) {
    if (uVar2 - uVar7 < 5 || uVar5 != 0xfe) {
      return -0xe;
    }
    uVar5 = (uint)puVar3[uVar7 + 4] |
            (uint)puVar3[uVar7 + 3] << 8 |
            (uint)puVar3[uVar7 + 2] << 0x10 | (uint)puVar3[uVar7 + 1] << 0x18;
    iVar6 = 5;
  }
  else {
    uVar5 = (uint)CONCAT11(puVar3[uVar7 + 1],puVar3[uVar7 + 2]);
    iVar6 = 3;
  }
  uVar7 = iVar6 + uVar7;
  decoder->offset = uVar7;
  if (uVar5 == 0x17) {
    _Var4 = false;
  }
  else {
    if (uVar5 != 0x2e) {
      return -0xc;
    }
    _Var4 = true;
  }
  signature->is_interest = _Var4;
  bVar1 = puVar3[uVar7];
  if (bVar1 < 0xfd) {
    iVar6 = 1;
    uVar5 = (uint)bVar1;
  }
  else if (uVar2 - uVar7 < 3 || bVar1 != 0xfd) {
    if (uVar2 - uVar7 < 5 || bVar1 != 0xfe) goto LAB_0010fbc1;
    uVar5 = (uint)puVar3[uVar7 + 4] |
            (uint)puVar3[uVar7 + 3] << 8 |
            (uint)puVar3[uVar7 + 2] << 0x10 | (uint)puVar3[uVar7 + 1] << 0x18;
    iVar6 = 5;
  }
  else {
    uVar5 = (uint)CONCAT11(puVar3[uVar7 + 1],puVar3[uVar7 + 2]);
    iVar6 = 3;
  }
  uVar7 = uVar7 + iVar6;
  decoder->offset = uVar7;
LAB_0010fbc1:
  iVar6 = -0xd;
  if (0xffffffd6 < uVar5 - 0x49) {
    signature->sig_size = uVar5;
    iVar6 = -10;
    if ((int)uVar5 <= (int)(uVar2 - uVar7)) {
      memcpy(signature->sig_value,puVar3 + uVar7,(ulong)uVar5);
      decoder->offset = decoder->offset + uVar5;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int
ndn_signature_value_tlv_decode(ndn_decoder_t* decoder, ndn_signature_t* signature)
{
  int ret_val = -1;
  uint32_t probe = 0;
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (probe == TLV_SignatureValue) {
    signature->is_interest = false;
  }
  else if (probe == TLV_InterestSignatureValue) {
    signature->is_interest = true;
  }
  else {
    return NDN_WRONG_TLV_TYPE;
  }
  ret_val = decoder_get_length(decoder, &probe);
  if (probe > NDN_SEC_MAX_SIG_SIZE)
    return NDN_WRONG_TLV_LENGTH;
  if (probe < NDN_SEC_MIN_SIG_SIZE)
    return NDN_WRONG_TLV_LENGTH;
  signature->sig_size = probe;
  ret_val = decoder_get_raw_buffer_value(decoder, signature->sig_value, signature->sig_size);
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}